

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_lazy_xor_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  byte type1;
  long lVar1;
  byte type2_00;
  int iVar2;
  shared_container_t *bitset;
  container_t *c;
  shared_container_t *psVar3;
  bitset_container_t *src_2;
  ulong uVar4;
  ushort key;
  uint8_t uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint16_t uVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  uint8_t type2;
  uint8_t result_type;
  byte local_62;
  uint8_t local_61;
  uint local_60;
  uint local_5c;
  shared_container_t *local_58;
  ulong local_50;
  ulong local_48;
  bitset_container_t *local_40;
  roaring_array_t *local_38;
  
  local_61 = '\0';
  local_60 = (x2->high_low_container).size;
  if (local_60 == 0) {
    return;
  }
  uVar11 = (x1->high_low_container).size;
  uVar4 = (ulong)uVar11;
  if (uVar11 == 0) {
    roaring_bitmap_overwrite(x1,x2);
    return;
  }
  uVar9 = *(x1->high_low_container).keys;
  key = *(x2->high_low_container).keys;
  uVar8 = 0;
  uVar6 = 0;
  local_38 = &x2->high_low_container;
LAB_00105f34:
  do {
    uVar11 = (uint)uVar6;
    uVar8 = (ulong)(int)uVar8;
    uVar10 = (int)uVar4 - 1;
    while( true ) {
      uVar7 = (uint)uVar8;
      if (uVar9 == key) break;
      if (key <= uVar9) {
        local_62 = (x2->high_low_container).typecodes[uVar6 & 0xffff];
        local_50 = uVar4;
        c = get_copy_of_container
                      ((x2->high_low_container).containers[uVar6 & 0xffff],&local_62,
                       (_Bool)((x2->high_low_container).flags & 1));
        if (((x2->high_low_container).flags & 1) != 0) {
          (x2->high_low_container).containers[(int)uVar11] = c;
          (x2->high_low_container).typecodes[(int)uVar11] = local_62;
        }
        ra_insert_new_key_value_at(&x1->high_low_container,uVar7,key,c,local_62);
        uVar11 = uVar11 + 1;
        uVar6 = (ulong)uVar11;
        if (uVar11 != local_60) {
          key = (x2->high_low_container).keys[uVar6 & 0xffff];
        }
        uVar4 = (ulong)((int)local_50 + 1);
        if (uVar11 == local_60) {
LAB_001061cd:
          uVar7 = uVar7 + 1;
          goto LAB_001061d0;
        }
        uVar8 = uVar8 + 1;
        goto LAB_00105f34;
      }
      if (uVar10 == uVar7) goto LAB_001061cd;
      uVar8 = uVar8 + 1;
      uVar9 = (x1->high_low_container).keys[uVar8 & 0xffff];
    }
    type1 = (x1->high_low_container).typecodes[uVar8 & 0xffff];
    bitset = (shared_container_t *)(x1->high_low_container).containers[uVar8 & 0xffff];
    local_62 = (x2->high_low_container).typecodes[uVar6 & 0xffff];
    src_2 = (bitset_container_t *)(x2->high_low_container).containers[uVar6 & 0xffff];
    local_5c = uVar11;
    if (type1 == 4) {
      local_58 = bitset;
      local_50 = uVar4;
      bitset = (shared_container_t *)container_lazy_xor(bitset,'\x04',src_2,local_62,&local_61);
      shared_container_free(local_58);
    }
    else {
      type2_00 = local_62;
      if (local_62 == 4) {
        type2_00 = *(byte *)&src_2->words;
        src_2 = *(bitset_container_t **)src_2;
      }
      if ((uint)type2_00 + (uint)type1 * 4 == 5) {
        local_50 = uVar4;
        bitset_container_xor_nocard((bitset_container_t *)bitset,src_2,(bitset_container_t *)bitset)
        ;
        local_61 = '\x01';
      }
      else {
        local_50 = uVar4;
        if ((type1 == 1) && (*(int *)&bitset->container == -1)) {
          local_58 = bitset;
          local_48 = (ulong)type2_00;
          local_40 = src_2;
          iVar2 = bitset_container_compute_cardinality((bitset_container_t *)bitset);
          type2_00 = (byte)local_48;
          *(int *)&local_58->container = iVar2;
          src_2 = local_40;
          bitset = local_58;
        }
        bitset = (shared_container_t *)container_ixor(bitset,type1,src_2,type2_00,&local_61);
      }
    }
    x2 = (roaring_bitmap_t *)local_38;
    psVar3 = bitset;
    uVar5 = local_61;
    if (local_61 == '\x04') {
      uVar5 = bitset->typecode;
      psVar3 = (shared_container_t *)bitset->container;
    }
    iVar2 = *(int *)&psVar3->container;
    if ((uVar5 == '\x03') || (uVar5 == '\x02')) {
      bVar12 = 0 < iVar2;
    }
    else {
      if (iVar2 == -1) {
        if (**(uint64_t **)&psVar3->typecode == 0) {
          uVar4 = 0xffffffffffffffff;
          do {
            if (uVar4 == 0x3fe) {
              uVar6 = 0x3ff;
              break;
            }
            uVar6 = uVar4 + 1;
            lVar1 = uVar4 + 2;
            uVar4 = uVar6;
          } while ((*(uint64_t **)&psVar3->typecode)[lVar1] == 0);
          bVar12 = 0x3fe < uVar6;
        }
        else {
          bVar12 = false;
        }
      }
      else {
        bVar12 = iVar2 == 0;
      }
      bVar12 = (bool)(bVar12 ^ 1);
    }
    if (bVar12) {
      (x1->high_low_container).containers[uVar8] = bitset;
      (x1->high_low_container).typecodes[uVar8] = local_61;
      uVar8 = (ulong)(uVar7 + 1);
      uVar4 = local_50;
    }
    else {
      container_free(bitset,local_61);
      ra_remove_at_index(&x1->high_low_container,uVar7);
      uVar4 = (ulong)uVar10;
    }
    uVar11 = local_5c + 1;
    uVar6 = (ulong)uVar11;
    uVar7 = (uint)uVar8;
    if (uVar11 == local_60 || uVar7 == (uint)uVar4) {
LAB_001061d0:
      if (uVar7 != (uint)uVar4) {
        return;
      }
      ra_append_copy_range
                (&x1->high_low_container,&x2->high_low_container,uVar11,local_60,
                 (_Bool)((x2->high_low_container).flags & 1));
      return;
    }
    uVar9 = (x1->high_low_container).keys[uVar7 & 0xffff];
    key = (x2->high_low_container).keys[uVar11 & 0xffff];
  } while( true );
}

Assistant:

void roaring_bitmap_lazy_xor_inplace(roaring_bitmap_t *x1,
                                     const roaring_bitmap_t *x2) {
    assert(x1 != x2);
    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_overwrite(x1, x2);
        return;
    }
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared
            // container. Rationale: using a shared container safely with in
            // place computation would require making a copy and then doing the
            // computation in place which is likely less efficient than avoiding
            // in place entirely and always generating a new container.

            container_t *c;
            if (type1 == SHARED_CONTAINER_TYPE) {
                c = container_lazy_xor(c1, type1, c2, type2, &result_type);
                shared_container_free(CAST_shared(c1));  // release
            } else {
                c = container_lazy_ixor(c1, type1, c2, type2, &result_type);
            }

            if (container_nonzero_cardinality(c, result_type)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c,
                                          result_type);
                ++pos1;
            } else {
                container_free(c, result_type);
                ra_remove_at_index(&x1->high_low_container, pos1);
                --length1;
            }
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            // container_t *c2_clone = container_clone(c2, type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_insert_new_key_value_at(&x1->high_low_container, pos1, s2, c2,
                                       type2);
            pos1++;
            length1++;
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&x1->high_low_container, &x2->high_low_container,
                             pos2, length2, is_cow(x2));
    }
}